

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlStringGetNodeList(xmlDoc *doc,xmlChar *value)

{
  byte bVar1;
  int iVar2;
  xmlBufPtr buf;
  xmlChar *pxVar3;
  xmlEntityPtr pxVar4;
  xmlNodePtr pxVar5;
  xmlChar *pxVar6;
  xmlNodePtr pxVar7;
  xmlNodePtr elem;
  _xmlNode *p_Var8;
  byte *pbVar9;
  long lVar10;
  int code;
  byte *pbVar11;
  bool bVar12;
  xmlNodePtr local_50;
  xmlChar buffer [10];
  
  if (value == (xmlChar *)0x0) {
    pxVar5 = (xmlNodePtr)0x0;
  }
  else {
    pxVar5 = (xmlNodePtr)0x0;
    buf = xmlBufCreateSize(0);
    if (buf != (xmlBufPtr)0x0) {
      xmlBufSetAllocationScheme(buf,XML_BUFFER_ALLOC_HYBRID);
      local_50 = (xmlNodePtr)0x0;
      elem = (xmlNodePtr)0x0;
      do {
        do {
          while( true ) {
            pbVar11 = value + 2;
            pbVar9 = value;
            while( true ) {
              pxVar5 = elem;
              if (*pbVar9 == 0) {
                if ((pbVar9 != value) || (elem == (xmlNodePtr)0x0)) {
                  xmlBufAdd(buf,value,(int)pbVar9 - (int)value);
                }
                iVar2 = xmlBufIsEmpty(buf);
                if (iVar2 == 0) {
                  pxVar7 = xmlNewDocText(doc,(xmlChar *)0x0);
                  pxVar5 = (xmlNodePtr)0x0;
                  if (pxVar7 != (xmlNodePtr)0x0) {
                    pxVar3 = xmlBufDetach(buf);
                    pxVar7->content = pxVar3;
                    pxVar5 = pxVar7;
                    if (local_50 != (xmlNodePtr)0x0) {
                      xmlAddNextSibling(local_50,pxVar7);
                      pxVar5 = elem;
                    }
                  }
                }
                goto LAB_00183704;
              }
              if (*pbVar9 == 0x26) break;
              pbVar9 = pbVar9 + 1;
              pbVar11 = pbVar11 + 1;
            }
            if ((pbVar9 != value) &&
               (iVar2 = xmlBufAdd(buf,value,(int)pbVar9 - (int)value), iVar2 != 0))
            goto LAB_00183704;
            bVar1 = pbVar9[1];
            if (bVar1 == 0x23) break;
            lVar10 = 0;
            value = pbVar11;
            while( true ) {
              if (bVar1 == 0) {
                xmlTreeErr(0x516,(xmlNodePtr)doc,(char *)(pbVar9 + 1));
                goto LAB_00183704;
              }
              if (bVar1 == 0x3b) break;
              bVar1 = *value;
              value = value + 1;
              lVar10 = lVar10 + 1;
            }
            if (lVar10 != 0) {
              pxVar3 = xmlStrndup(pbVar9 + 1,(int)lVar10);
              pxVar4 = xmlGetDocEntity(doc,pxVar3);
              if ((pxVar4 == (xmlEntityPtr)0x0) || (pxVar4->etype != XML_INTERNAL_PREDEFINED_ENTITY)
                 ) {
                iVar2 = xmlBufIsEmpty(buf);
                pxVar7 = local_50;
                if (iVar2 == 0) {
                  pxVar5 = xmlNewDocText(doc,(xmlChar *)0x0);
                  pxVar6 = xmlBufDetach(buf);
                  pxVar5->content = pxVar6;
                  pxVar7 = pxVar5;
                  if (local_50 != (xmlNodePtr)0x0) {
                    pxVar7 = xmlAddNextSibling(local_50,pxVar5);
                    pxVar5 = elem;
                  }
                }
                local_50 = pxVar7;
                elem = xmlNewReference(doc,pxVar3);
                if (elem == (xmlNodePtr)0x0) {
                  if (pxVar3 != (xmlChar *)0x0) {
                    (*xmlFree)(pxVar3);
                  }
                  goto LAB_00183704;
                }
                if ((pxVar4 != (xmlEntityPtr)0x0) && (pxVar4->children == (_xmlNode *)0x0)) {
                  pxVar4->children = (_xmlNode *)0xffffffffffffffff;
                  p_Var8 = xmlStringGetNodeList(doc,elem->content);
                  pxVar4->children = p_Var8;
                  pxVar4->owner = 1;
                  for (; p_Var8 != (_xmlNode *)0x0; p_Var8 = p_Var8->next) {
                    p_Var8->parent = (_xmlNode *)pxVar4;
                    pxVar4->last = p_Var8;
                  }
                }
                pxVar7 = elem;
                if (local_50 != (xmlNodePtr)0x0) {
                  pxVar7 = xmlAddNextSibling(local_50,elem);
                  elem = pxVar5;
                }
              }
              else {
                iVar2 = xmlBufCat(buf,pxVar4->content);
                pxVar7 = local_50;
                if (iVar2 != 0) goto LAB_00183704;
              }
              local_50 = pxVar7;
              (*xmlFree)(pxVar3);
            }
          }
          bVar1 = pbVar9[2];
          if (bVar1 == 0x78) {
            pbVar9 = pbVar9 + 3;
            iVar2 = 0;
            while( true ) {
              bVar1 = *pbVar9;
              bVar12 = bVar1 == 0x3b;
              if (bVar12) break;
              if (9 < (byte)(bVar1 - 0x30)) {
                if ((byte)(bVar1 + 0x9f) < 6) {
                  iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x57;
                  goto LAB_00183506;
                }
                if ((byte)(bVar1 + 0xbf) < 6) {
                  iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x37;
                  goto LAB_00183506;
                }
                code = 0x514;
LAB_00183545:
                iVar2 = 0;
                xmlTreeErr(code,(xmlNodePtr)doc,(char *)0x0);
                break;
              }
              iVar2 = iVar2 * 0x10 + (uint)bVar1 + -0x30;
LAB_00183506:
              pbVar9 = pbVar9 + 1;
            }
          }
          else {
            pbVar9 = pbVar9 + 2;
            iVar2 = 0;
            while (bVar12 = bVar1 == 0x3b, !bVar12) {
              if (9 < (byte)(bVar1 - 0x30)) {
                code = 0x515;
                goto LAB_00183545;
              }
              iVar2 = (uint)bVar1 + iVar2 * 10 + -0x30;
              pbVar11 = pbVar9 + 1;
              pbVar9 = pbVar9 + 1;
              bVar1 = *pbVar11;
            }
          }
          value = pbVar9 + bVar12;
        } while (iVar2 == 0);
        iVar2 = xmlCopyCharMultiByte(buffer,iVar2);
        buffer[iVar2] = '\0';
        iVar2 = xmlBufCat(buf,buffer);
      } while (iVar2 == 0);
LAB_00183704:
      xmlBufFree(buf);
    }
  }
  return pxVar5;
}

Assistant:

xmlNodePtr
xmlStringGetNodeList(const xmlDoc *doc, const xmlChar *value) {
    xmlNodePtr ret = NULL, last = NULL;
    xmlNodePtr node;
    xmlChar *val;
    const xmlChar *cur = value;
    const xmlChar *q;
    xmlEntityPtr ent;
    xmlBufPtr buf;

    if (value == NULL) return(NULL);

    buf = xmlBufCreateSize(0);
    if (buf == NULL) return(NULL);
    xmlBufSetAllocationScheme(buf, XML_BUFFER_ALLOC_HYBRID);

    q = cur;
    while (*cur != 0) {
	if (cur[0] == '&') {
	    int charval = 0;
	    xmlChar tmp;

	    /*
	     * Save the current text.
	     */
            if (cur != q) {
		if (xmlBufAdd(buf, q, cur - q))
		    goto out;
	    }
	    q = cur;
	    if ((cur[1] == '#') && (cur[2] == 'x')) {
		cur += 3;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loop */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 16 + (tmp - '0');
		    else if ((tmp >= 'a') && (tmp <= 'f'))
			charval = charval * 16 + (tmp - 'a') + 10;
		    else if ((tmp >= 'A') && (tmp <= 'F'))
			charval = charval * 16 + (tmp - 'A') + 10;
		    else {
			xmlTreeErr(XML_TREE_INVALID_HEX, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else if  (cur[1] == '#') {
		cur += 2;
		tmp = *cur;
		while (tmp != ';') { /* Non input consuming loops */
		    if ((tmp >= '0') && (tmp <= '9'))
			charval = charval * 10 + (tmp - '0');
		    else {
			xmlTreeErr(XML_TREE_INVALID_DEC, (xmlNodePtr) doc,
			           NULL);
			charval = 0;
			break;
		    }
		    cur++;
		    tmp = *cur;
		}
		if (tmp == ';')
		    cur++;
		q = cur;
	    } else {
		/*
		 * Read the entity string
		 */
		cur++;
		q = cur;
		while ((*cur != 0) && (*cur != ';')) cur++;
		if (*cur == 0) {
		    xmlTreeErr(XML_TREE_UNTERMINATED_ENTITY,
		               (xmlNodePtr) doc, (const char *) q);
		    goto out;
		}
		if (cur != q) {
		    /*
		     * Predefined entities don't generate nodes
		     */
		    val = xmlStrndup(q, cur - q);
		    ent = xmlGetDocEntity(doc, val);
		    if ((ent != NULL) &&
			(ent->etype == XML_INTERNAL_PREDEFINED_ENTITY)) {

			if (xmlBufCat(buf, ent->content))
			    goto out;

		    } else {
			/*
			 * Flush buffer so far
			 */
			if (!xmlBufIsEmpty(buf)) {
			    node = xmlNewDocText(doc, NULL);
			    node->content = xmlBufDetach(buf);

			    if (last == NULL) {
				last = ret = node;
			    } else {
				last = xmlAddNextSibling(last, node);
			    }
			}

			/*
			 * Create a new REFERENCE_REF node
			 */
			node = xmlNewReference(doc, val);
			if (node == NULL) {
			    if (val != NULL) xmlFree(val);
			    goto out;
			}
			else if ((ent != NULL) && (ent->children == NULL)) {
			    xmlNodePtr temp;

                            /* Set to non-NULL value to avoid recursion. */
			    ent->children = (xmlNodePtr) -1;
			    ent->children = xmlStringGetNodeList(doc,
				    (const xmlChar*)node->content);
			    ent->owner = 1;
			    temp = ent->children;
			    while (temp) {
				temp->parent = (xmlNodePtr)ent;
				ent->last = temp;
				temp = temp->next;
			    }
			}
			if (last == NULL) {
			    last = ret = node;
			} else {
			    last = xmlAddNextSibling(last, node);
			}
		    }
		    xmlFree(val);
		}
		cur++;
		q = cur;
	    }
	    if (charval != 0) {
		xmlChar buffer[10];
		int len;

		len = xmlCopyCharMultiByte(buffer, charval);
		buffer[len] = 0;

		if (xmlBufCat(buf, buffer))
		    goto out;
		charval = 0;
	    }
	} else
	    cur++;
    }
    if ((cur != q) || (ret == NULL)) {
        /*
	 * Handle the last piece of text.
	 */
	xmlBufAdd(buf, q, cur - q);
    }

    if (!xmlBufIsEmpty(buf)) {
	node = xmlNewDocText(doc, NULL);
        if (node == NULL) {
            xmlBufFree(buf);
            return(NULL);
        }
	node->content = xmlBufDetach(buf);

	if (last == NULL) {
	    ret = node;
	} else {
	    xmlAddNextSibling(last, node);
	}
    }

out:
    xmlBufFree(buf);
    return(ret);
}